

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void jpeg_make_c_derived_tbl(j_compress_ptr cinfo,boolean isDC,int tblno,c_derived_tbl **pdtbl)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  c_derived_tbl *pcVar4;
  JHUFF_TBL *local_578;
  uint local_56c;
  uint uStack_568;
  uint code;
  uint huffcode [257];
  char local_158 [8];
  char huffsize [257];
  int local_44;
  int maxsymbol;
  int si;
  int lastp;
  int l;
  int i;
  int p;
  c_derived_tbl *dtbl;
  JHUFF_TBL *htbl;
  c_derived_tbl **pdtbl_local;
  int tblno_local;
  boolean isDC_local;
  j_compress_ptr cinfo_local;
  
  if ((tblno < 0) || (3 < tblno)) {
    cinfo->err->msg_code = 0x34;
    (cinfo->err->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (isDC == 0) {
    local_578 = cinfo->ac_huff_tbl_ptrs[tblno];
  }
  else {
    local_578 = cinfo->dc_huff_tbl_ptrs[tblno];
  }
  if (local_578 == (JHUFF_TBL *)0x0) {
    cinfo->err->msg_code = 0x34;
    (cinfo->err->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (*pdtbl == (c_derived_tbl *)0x0) {
    pcVar4 = (c_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x500);
    *pdtbl = pcVar4;
  }
  pcVar4 = *pdtbl;
  l = 0;
  for (si = 1; iVar1 = l, si < 0x11; si = si + 1) {
    lastp = (int)local_578->bits[si];
    if (0x100 < l + lastp) {
      cinfo->err->msg_code = 9;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    while (lastp != 0) {
      local_158[l] = (char)si;
      lastp = lastp + -1;
      l = l + 1;
    }
  }
  local_158[l] = '\0';
  local_56c = 0;
  local_44 = (int)local_158[0];
  l = 0;
  while (local_158[l] != '\0') {
    while (local_158[l] == local_44) {
      (&uStack_568)[l] = local_56c;
      local_56c = local_56c + 1;
      l = l + 1;
    }
    if (1L << ((byte)local_44 & 0x3f) <= (long)(ulong)local_56c) {
      cinfo->err->msg_code = 9;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    local_56c = local_56c << 1;
    local_44 = local_44 + 1;
  }
  memset(pcVar4->ehufsi,0,0x100);
  uVar2 = 0xff;
  if (isDC != 0) {
    uVar2 = 0xf;
  }
  for (l = 0; l < iVar1; l = l + 1) {
    uVar3 = (uint)local_578->huffval[l];
    if ((uVar2 < uVar3) || (pcVar4->ehufsi[(int)uVar3] != '\0')) {
      cinfo->err->msg_code = 9;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pcVar4->ehufco[(int)uVar3] = (&uStack_568)[l];
    pcVar4->ehufsi[(int)uVar3] = local_158[l];
  }
  return;
}

Assistant:

LOCAL(void)
jpeg_make_c_derived_tbl (j_compress_ptr cinfo, boolean isDC, int tblno,
			 c_derived_tbl ** pdtbl)
{
  JHUFF_TBL *htbl;
  c_derived_tbl *dtbl;
  int p, i, l, lastp, si, maxsymbol;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (c_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(c_derived_tbl));
  dtbl = *pdtbl;
  
  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int) htbl->bits[l];
    if (i < 0 || p + i > 256)	/* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char) l;
  }
  huffsize[p] = 0;
  lastp = p;
  
  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int) huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((INT32) code) >= (((INT32) 1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }
  
  /* Figure C.3: generate encoding tables */
  /* These are code and size indexed by symbol value */

  /* Set all codeless symbols to have code length 0;
   * this lets us detect duplicate VAL entries here, and later
   * allows emit_bits to detect any attempt to emit such symbols.
   */
  MEMZERO(dtbl->ehufsi, SIZEOF(dtbl->ehufsi));

  /* This is also a convenient place to check for out-of-range
   * and duplicated VAL entries.  We allow 0..255 for AC symbols
   * but only 0..15 for DC.  (We could constrain them further
   * based on data depth and mode, but this seems enough.)
   */
  maxsymbol = isDC ? 15 : 255;

  for (p = 0; p < lastp; p++) {
    i = htbl->huffval[p];
    if (i < 0 || i > maxsymbol || dtbl->ehufsi[i])
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    dtbl->ehufco[i] = huffcode[p];
    dtbl->ehufsi[i] = huffsize[p];
  }
}